

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Preprocessor::parseBranchDirective
          (Preprocessor *this,Token directive,Token condition,bool taken)

{
  SmallVector<slang::parsing::Token,_2UL> *this_00;
  BumpAllocator *this_01;
  Token TVar1;
  SyntaxKind SVar2;
  int iVar3;
  undefined4 extraout_var;
  ConditionalBranchDirectiveSyntax *syntax;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  EVP_PKEY_CTX *src_00;
  Info *extraout_RDX_00;
  undefined3 in_register_00000089;
  SourceRange range;
  Token token;
  SyntaxKind local_6c;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_48.info = condition.info;
  local_48._0_8_ = condition._0_8_;
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  this_00 = &this->scratchTokenBuffer;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  if (CONCAT31(in_register_00000089,taken) == 0) {
    do {
      local_68 = nextRaw(this);
      if (local_68.kind == Directive) {
        SVar2 = Token::directiveKind(&local_68);
        if ((SVar2 - ElsIfDirective < 0x40) &&
           ((0xa000000000004009U >> ((ulong)(SVar2 - ElsIfDirective) & 0x3f) & 1) != 0))
        goto LAB_00191e5c;
      }
      else if (local_68.kind == EndOfFile) goto LAB_00191e3e;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,&local_68);
    } while( true );
  }
LAB_00191e68:
  this_01 = this->alloc;
  if (local_48.info == (Info *)0x0) {
    local_6c = Token::directiveKind(&local_58);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src_00);
    local_68.rawLen = extraout_var_00;
    local_68.kind = (short)iVar3;
    local_68._2_1_ = (char)((uint)iVar3 >> 0x10);
    local_68.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    local_68.info = extraout_RDX_00;
    syntax = (ConditionalBranchDirectiveSyntax *)
             BumpAllocator::
             emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,nonstd::span_lite::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_6c,&local_58,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&local_68);
  }
  else {
    local_6c = Token::directiveKind(&local_58);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src);
    local_68.rawLen = extraout_var;
    local_68.kind = (short)iVar3;
    local_68._2_1_ = (char)((uint)iVar3 >> 0x10);
    local_68.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    local_68.info = extraout_RDX;
    syntax = BumpAllocator::
             emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::parsing::Token&,nonstd::span_lite::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_6c,&local_58,&local_48,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&local_68);
  }
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
LAB_00191e3e:
  range = Token::range(&local_58);
  Diagnostics::add(this->diagnostics,(DiagCode)0x120004,range);
LAB_00191e5c:
  TVar1 = local_68;
  (this->currentToken).kind = local_68.kind;
  (this->currentToken).field_0x2 = local_68._2_1_;
  (this->currentToken).numFlags = (NumericTokenFlags)local_68.numFlags.raw;
  (this->currentToken).rawLen = local_68.rawLen;
  (this->currentToken).info = local_68.info;
  local_68 = TVar1;
  goto LAB_00191e68;
}

Assistant:

Trivia Preprocessor::parseBranchDirective(Token directive, Token condition, bool taken) {
    scratchTokenBuffer.clear();
    if (!taken) {
        // skip over everything until we find another conditional compilation directive
        while (true) {
            auto token = nextRaw();

            // EoF or conditional directive stops the skipping process
            bool done = false;
            if (token.kind == TokenKind::EndOfFile) {
                addDiag(diag::MissingEndIfDirective, directive.range());
                done = true;
            }
            else if (token.kind == TokenKind::Directive) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        done = true;
                        break;
                    default:
                        break;
                }
            }

            if (done) {
                // put the token back so that we'll look at it next
                currentToken = token;
                break;
            }
            scratchTokenBuffer.push_back(token);
        }
    }

    SyntaxNode* syntax;
    if (condition) {
        syntax = alloc.emplace<ConditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                 directive, condition,
                                                                 scratchTokenBuffer.copy(alloc));
    }
    else {
        syntax = alloc.emplace<UnconditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                   directive,
                                                                   scratchTokenBuffer.copy(alloc));
    }
    return Trivia(TriviaKind::Directive, syntax);
}